

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ec_point_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *s;
  void *pvVar4;
  undefined1 local_38 [8];
  CBS ec_point_format_list;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    ec_point_format_list.len = (size_t)contents;
    uVar1 = ssl_protocol_version(hs->ssl);
    if (uVar1 < 0x304) {
      iVar2 = CBS_get_u8_length_prefixed((CBS *)ec_point_format_list.len,(CBS *)local_38);
      if ((iVar2 != 0) && (sVar3 = CBS_len((CBS *)ec_point_format_list.len), sVar3 == 0)) {
        s = CBS_data((CBS *)local_38);
        sVar3 = CBS_len((CBS *)local_38);
        pvVar4 = OPENSSL_memchr(s,0,sVar3);
        if (pvVar4 == (void *)0x0) {
          *out_alert = '/';
          return false;
        }
        return true;
      }
      hs_local._7_1_ = false;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ec_point_parse_serverhello(SSL_HANDSHAKE *hs,
                                           uint8_t *out_alert, CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    return false;
  }

  CBS ec_point_format_list;
  if (!CBS_get_u8_length_prefixed(contents, &ec_point_format_list) ||
      CBS_len(contents) != 0) {
    return false;
  }

  // Per RFC 4492, section 5.1.2, implementations MUST support the uncompressed
  // point format.
  if (OPENSSL_memchr(CBS_data(&ec_point_format_list),
                     TLSEXT_ECPOINTFORMAT_uncompressed,
                     CBS_len(&ec_point_format_list)) == NULL) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}